

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

int mbedtls_ecp_check_pubkey(mbedtls_ecp_group *grp,mbedtls_ecp_point *pt)

{
  mbedtls_mpi *X;
  mbedtls_mpi *Y;
  int iVar1;
  int iVar2;
  size_t sVar3;
  mbedtls_mpi YY;
  mbedtls_mpi local_60;
  mbedtls_mpi local_48;
  
  iVar1 = mbedtls_mpi_cmp_int(&pt->Z,1);
  iVar2 = -0x4c80;
  if (iVar1 == 0) {
    if ((grp->G).X.p == (mbedtls_mpi_uint *)0x0) {
      iVar2 = -0x4f80;
    }
    else if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
      sVar3 = mbedtls_mpi_size(&pt->X);
      iVar2 = -0x4c80;
      if (sVar3 <= grp->nbits + 7 >> 3) {
        iVar2 = 0;
      }
    }
    else {
      iVar1 = mbedtls_mpi_cmp_int(&pt->X,0);
      iVar2 = -0x4c80;
      if (-1 < iVar1) {
        X = &pt->Y;
        iVar1 = mbedtls_mpi_cmp_int(X,0);
        if (-1 < iVar1) {
          Y = &grp->P;
          iVar1 = mbedtls_mpi_cmp_mpi(&pt->X,Y);
          if ((iVar1 < 0) && (iVar1 = mbedtls_mpi_cmp_mpi(X,Y), iVar1 < 0)) {
            mbedtls_mpi_init(&local_48);
            mbedtls_mpi_init(&local_60);
            iVar2 = mbedtls_mpi_mul_mpi(&local_48,X,X);
            if ((iVar2 == 0) && (iVar2 = ecp_modp(&local_48,grp), iVar2 == 0)) {
              mul_count = mul_count + 1;
              iVar2 = mbedtls_mpi_mul_mpi(&local_60,&pt->X,&pt->X);
              if ((iVar2 == 0) && (iVar2 = ecp_modp(&local_60,grp), iVar2 == 0)) {
                mul_count = mul_count + 1;
                if ((grp->A).p == (mbedtls_mpi_uint *)0x0) {
                  iVar2 = mbedtls_mpi_sub_int(&local_60,&local_60,3);
                  if (iVar2 == 0) {
                    do {
                      if ((-1 < local_60.s) ||
                         (iVar2 = mbedtls_mpi_cmp_int(&local_60,0), iVar2 == 0)) goto LAB_00121b73;
                      iVar2 = mbedtls_mpi_add_mpi(&local_60,&local_60,Y);
                    } while (iVar2 == 0);
                  }
                }
                else {
                  iVar2 = mbedtls_mpi_add_mod(grp,&local_60,&local_60,&grp->A);
                  if (iVar2 == 0) {
LAB_00121b73:
                    iVar2 = mbedtls_mpi_mul_mod(grp,&local_60,&local_60,&pt->X);
                    if ((iVar2 == 0) &&
                       (iVar2 = mbedtls_mpi_add_mod(grp,&local_60,&local_60,&grp->B), iVar2 == 0)) {
                      iVar1 = mbedtls_mpi_cmp_mpi(&local_48,&local_60);
                      iVar2 = -0x4c80;
                      if (iVar1 == 0) {
                        iVar2 = 0;
                      }
                    }
                  }
                }
              }
            }
            mbedtls_mpi_free(&local_48);
            mbedtls_mpi_free(&local_60);
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_ecp_check_pubkey( const mbedtls_ecp_group *grp,
                              const mbedtls_ecp_point *pt )
{
    ECP_VALIDATE_RET( grp != NULL );
    ECP_VALIDATE_RET( pt  != NULL );

    /* Must use affine coordinates */
    if( mbedtls_mpi_cmp_int( &pt->Z, 1 ) != 0 )
        return( MBEDTLS_ERR_ECP_INVALID_KEY );

#if defined(ECP_MONTGOMERY)
    if( mbedtls_ecp_get_type( grp ) == MBEDTLS_ECP_TYPE_MONTGOMERY )
        return( ecp_check_pubkey_mx( grp, pt ) );
#endif
#if defined(ECP_SHORTWEIERSTRASS)
    if( mbedtls_ecp_get_type( grp ) == MBEDTLS_ECP_TYPE_SHORT_WEIERSTRASS )
        return( ecp_check_pubkey_sw( grp, pt ) );
#endif
    return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );
}